

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O2

void __thiscall wasm::ExecutionResults::printValue(ExecutionResults *this,Literal *value)

{
  Type *this_00;
  Type TVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  Literal *this_01;
  Literal in_stack_ffffffffffffff78;
  Literal local_68;
  Type local_50;
  HeapType local_48;
  undefined1 local_40 [8];
  Type type;
  
  this_00 = &value->type;
  TVar1.id = (value->type).id;
  Type::Type(&local_50,(HeapType)0x8,Nullable,Inexact);
  cVar2 = ::wasm::Type::isSubType(TVar1,local_50);
  if ((cVar2 != '\0') && (bVar3 = Type::isString(this_00), !bVar3)) {
    ::wasm::Literal::internalize();
    ::wasm::Literal::operator=(value,(Literal *)local_40);
    ::wasm::Literal::~Literal((Literal *)local_40);
  }
  if ((this_00->id & 1) == 0 && 6 < this_00->id) {
    local_40 = (undefined1  [8])Type::getHeapType(this_00);
    bVar3 = HeapType::isMaybeShared((HeapType *)local_40,any);
    if (bVar3) {
      ::wasm::Literal::externalize();
      ::wasm::Literal::operator=(value,(Literal *)local_40);
      ::wasm::Literal::~Literal((Literal *)local_40);
    }
  }
  local_40 = (undefined1  [8])this_00->id;
  if (((ulong)local_40 & 1) == 0 && 6 < (ulong)local_40) {
    bVar3 = Type::isString((Type *)local_40);
    if (!bVar3) {
      local_48 = Type::getHeapType((Type *)local_40);
      bVar3 = HeapType::isMaybeShared(&local_48,i31);
      if (!bVar3) {
        bVar3 = Type::isNull(this_00);
        if (bVar3) {
          pcVar5 = "null\n";
        }
        else {
          bVar3 = Type::isFunction((Type *)local_40);
          if (bVar3) {
            pcVar5 = "function\n";
          }
          else {
            pcVar5 = "object\n";
          }
        }
        std::operator<<((ostream *)&std::cout,pcVar5);
        return;
      }
    }
    ::wasm::Literal::Literal((Literal *)&stack0xffffffffffffff80,value);
    poVar4 = (ostream *)::wasm::operator<<((ostream *)&std::cout,in_stack_ffffffffffffff78);
    std::operator<<(poVar4,'\n');
    this_01 = (Literal *)&stack0xffffffffffffff80;
  }
  else {
    ::wasm::Literal::Literal(&local_68,value);
    poVar4 = (ostream *)::wasm::operator<<((ostream *)&std::cout,in_stack_ffffffffffffff78);
    std::operator<<(poVar4,'\n');
    this_01 = &local_68;
  }
  ::wasm::Literal::~Literal(this_01);
  return;
}

Assistant:

void printValue(Literal value) {
    // Unwrap an externalized GC value to get the actual value, but not strings,
    // which are normally a subtype of ext.
    if (Type::isSubType(value.type, Type(HeapType::ext, Nullable)) &&
        !value.type.isString()) {
      value = value.internalize();
    }

    // An anyref literal is a string.
    if (value.type.isRef() &&
        value.type.getHeapType().isMaybeShared(HeapType::any)) {
      value = value.externalize();
    }

    // Don't print most reference values, as e.g. funcref(N) contains an index,
    // which is not guaranteed to remain identical after optimizations. Do not
    // print the type in detail (as even that may change due to closed-world
    // optimizations); just print a simple type like JS does, 'object' or
    // 'function', but also print null for a null (so a null function does not
    // get printed as object, as in JS we have typeof null == 'object').
    //
    // The only references we print in full are strings and i31s, which have
    // simple and stable internal structures that optimizations will not alter.
    auto type = value.type;
    if (type.isRef()) {
      if (type.isString() || type.getHeapType().isMaybeShared(HeapType::i31)) {
        std::cout << value << '\n';
      } else if (value.isNull()) {
        std::cout << "null\n";
      } else if (type.isFunction()) {
        std::cout << "function\n";
      } else {
        std::cout << "object\n";
      }
      return;
    }

    // Non-references can be printed in full.
    std::cout << value << '\n';
  }